

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

int test_cmdline_callback_(int id,char *arg)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int local_20;
  char *arg_local;
  int id_local;
  
  if (id == -0x7fffffff) {
    fprintf(_stderr,"Unrecognized command line option \'%s\'.\n",arg);
    fprintf(_stderr,"Try \'%s --help\' for more information.\n",test_argv0_);
    exit(2);
  }
  if (id == -0x7ffffffe) {
    fprintf(_stderr,"The command line option \'%s\' requires an argument.\n",arg);
    fprintf(_stderr,"Try \'%s --help\' for more information.\n",test_argv0_);
    exit(2);
  }
  if (id == -0x7ffffffd) {
    fprintf(_stderr,"The command line option \'%s\' does not expect an argument.\n",arg);
    fprintf(_stderr,"Try \'%s --help\' for more information.\n",test_argv0_);
    exit(2);
  }
  if (id == 0) {
    iVar1 = test_lookup_(arg);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s: Unrecognized unit test \'%s\'\n",test_argv0_,arg);
      fprintf(_stderr,"Try \'%s --list\' for list of unit tests.\n",test_argv0_);
      exit(2);
    }
  }
  else if (id == 0x43) {
    test_colorize_ = 0;
  }
  else if (id == 0x45) {
    test_no_exec_ = 1;
  }
  else if (id == 0x53) {
    test_no_summary_ = 1;
  }
  else if (id == 0x54) {
    test_tap_ = 1;
  }
  else if (id == 99) {
    if ((arg == (char *)0x0) || (iVar1 = strcmp(arg,"always"), iVar1 == 0)) {
      test_colorize_ = 1;
    }
    else {
      iVar1 = strcmp(arg,"never");
      if (iVar1 == 0) {
        test_colorize_ = 0;
      }
      else {
        iVar1 = strcmp(arg,"auto");
        if (iVar1 != 0) {
          fprintf(_stderr,"%s: Unrecognized argument \'%s\' for option --color.\n",test_argv0_,arg);
          fprintf(_stderr,"Try \'%s --help\' for more information.\n",test_argv0_);
          exit(2);
        }
      }
    }
  }
  else if (id == 0x65) {
    if ((arg == (char *)0x0) || (iVar1 = strcmp(arg,"always"), iVar1 == 0)) {
      test_no_exec_ = 0;
    }
    else {
      iVar1 = strcmp(arg,"never");
      if (iVar1 == 0) {
        test_no_exec_ = 1;
      }
      else {
        iVar1 = strcmp(arg,"auto");
        if (iVar1 != 0) {
          fprintf(_stderr,"%s: Unrecognized argument \'%s\' for option --exec.\n",test_argv0_,arg);
          fprintf(_stderr,"Try \'%s --help\' for more information.\n",test_argv0_);
          exit(2);
        }
      }
    }
  }
  else {
    if (id == 0x68) {
      test_help_();
      exit(0);
    }
    if (id == 0x6c) {
      test_list_names_();
      exit(0);
    }
    if (id == 0x71) {
      test_verbose_level_ = 0;
    }
    else if (id == 0x73) {
      test_skip_mode_ = 1;
    }
    else if (id == 0x74) {
      if ((arg == (char *)0x0) || (iVar1 = strcmp(arg,"real"), iVar1 == 0)) {
        test_timer_ = 1;
      }
      else {
        iVar1 = strcmp(arg,"cpu");
        if (iVar1 != 0) {
          fprintf(_stderr,"%s: Unrecognized argument \'%s\' for option --time.\n",test_argv0_,arg);
          fprintf(_stderr,"Try \'%s --help\' for more information.\n",test_argv0_);
          exit(2);
        }
        test_timer_ = 2;
      }
    }
    else if (id == 0x76) {
      if (arg == (char *)0x0) {
        local_20 = test_verbose_level_ + 1;
      }
      else {
        local_20 = atoi(arg);
      }
      test_verbose_level_ = local_20;
    }
    else if (id == 0x77) {
      test_worker_ = 1;
      test_worker_index_ = atoi(arg);
    }
    else if ((id == 0x78) &&
            (test_xml_output_ = (FILE *)fopen(arg,"w"), __stream = _stderr,
            (FILE *)test_xml_output_ == (FILE *)0x0)) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(__stream,"Unable to open \'%s\': %s\n",arg,pcVar3);
      exit(2);
    }
  }
  return 0;
}

Assistant:

static int
test_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 's':
            test_skip_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                test_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'E':
            test_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                test_timer_ = 1;
#ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                test_timer_ = 2;
#endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
#endif
            break;

        case 'S':
            test_no_summary_ = 1;
            break;

        case 'T':
            test_tap_ = 1;
            break;

        case 'l':
            test_list_names_();
            exit(0);

        case 'v':
            test_verbose_level_ = (arg != NULL ? atoi(arg) : test_verbose_level_+1);
            break;

        case 'q':
            test_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                test_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'C':
            test_colorize_ = 0;
            break;

        case 'h':
            test_help_();
            exit(0);

        case 'w':
            test_worker_ = 1;
            test_worker_index_ = atoi(arg);
            break;
        case 'x':
            test_xml_output_ = fopen(arg, "w");
            if (!test_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                exit(2);
            }
            break;

        case 0:
            if(test_lookup_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", test_argv0_);
                exit(2);
            }
            break;

        case TEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);
    }

    return 0;
}